

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseCleared<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Rep *pRVar2;
  LogMessage *pLVar3;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x80b);
    pLVar3 = LogMessage::operator<<(&local_110,"CHECK failed: GetArena() == NULL: ");
    pLVar3 = LogMessage::operator<<
                       (pLVar3,"ReleaseCleared() can only be used on a RepeatedPtrField not on ");
    pLVar3 = LogMessage::operator<<(pLVar3,"an arena.");
    LogFinisher::operator=((LogFinisher *)&local_d8,pLVar3);
    LogMessage::~LogMessage(&local_110);
  }
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x80e);
    pLVar3 = LogMessage::operator<<(&local_d8,"CHECK failed: GetArena() == NULL: ");
    LogFinisher::operator=((LogFinisher *)&local_a0,pLVar3);
    LogMessage::~LogMessage(&local_d8);
  }
  if (this->rep_ == (Rep *)0x0) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x80f);
    pLVar3 = LogMessage::operator<<(&local_a0,"CHECK failed: rep_ != NULL: ");
    LogFinisher::operator=((LogFinisher *)&local_68,pLVar3);
    LogMessage::~LogMessage(&local_a0);
  }
  if (this->rep_->allocated_size <= this->current_size_) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x810);
    pLVar3 = LogMessage::operator<<
                       (&local_68,"CHECK failed: (rep_->allocated_size) > (current_size_): ");
    LogFinisher::operator=(&local_29,pLVar3);
    LogMessage::~LogMessage(&local_68);
  }
  pRVar2 = this->rep_;
  iVar1 = pRVar2->allocated_size;
  pRVar2->allocated_size = iVar1 + -1;
  return (Type *)pRVar2->elements[(long)iVar1 + -1];
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::ReleaseCleared() {
  GOOGLE_DCHECK(GetArena() == NULL)
      << "ReleaseCleared() can only be used on a RepeatedPtrField not on "
      << "an arena.";
  GOOGLE_DCHECK(GetArena() == NULL);
  GOOGLE_DCHECK(rep_ != NULL);
  GOOGLE_DCHECK_GT(rep_->allocated_size, current_size_);
  return cast<TypeHandler>(rep_->elements[--rep_->allocated_size]);
}